

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManSave(If_DsdMan_t *p,char *pFileName)

{
  FILE *__s;
  void *pvVar1;
  int *__ptr;
  word *__ptr_00;
  size_t sVar2;
  char *__filename;
  long lVar3;
  int iVar4;
  int i;
  int Num;
  Vec_Int_t *local_38;
  
  __filename = pFileName;
  if (pFileName == (char *)0x0) {
    __filename = p->pStore;
  }
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    if (pFileName == (char *)0x0) {
      pFileName = p->pStore;
    }
    printf("Writing DSD manager file \"%s\" has failed.\n",pFileName);
    return;
  }
  fwrite("dsd1",4,1,__s);
  Num = p->nVars;
  fwrite(&Num,4,1,__s);
  Num = p->LutSize;
  fwrite(&Num,4,1,__s);
  Num = (p->vObjs).nSize;
  fwrite(&Num,4,1,__s);
  local_38 = &p->vTruths;
  for (iVar4 = 2; iVar4 < (p->vObjs).nSize; iVar4 = iVar4 + 1) {
    pvVar1 = Vec_PtrEntry(&p->vObjs,iVar4);
    Num = (*(uint *)((long)pvVar1 + 4) >> 0x1c) + 1 +
          (uint)((*(uint *)((long)pvVar1 + 4) >> 0x1b & 1) != 0);
    fwrite(&Num,4,1,__s);
    fwrite(pvVar1,(long)Num << 3,1,__s);
    if ((*(uint *)((long)pvVar1 + 4) & 7) == 6) {
      __ptr = Vec_IntEntryP(local_38,iVar4);
      fwrite(__ptr,4,1,__s);
    }
  }
  lVar3 = 3;
  do {
    if (p->nVars < lVar3) {
      Num = p->nConfigWords;
      fwrite(&Num,4,1,__s);
      Num = p->nTtBits;
      fwrite(&Num,4,1,__s);
      if (p->vConfigs == (Vec_Wrd_t *)0x0) {
        Num = 0;
      }
      else {
        Num = p->vConfigs->nSize;
      }
      fwrite(&Num,4,1,__s);
      if ((long)Num != 0) {
        fwrite(p->vConfigs->pArray,(long)Num << 3,1,__s);
      }
      if (p->pCellStr == (char *)0x0) {
        Num = 0;
      }
      else {
        sVar2 = strlen(p->pCellStr);
        Num = (int)sVar2;
      }
      fwrite(&Num,4,1,__s);
      if ((long)Num != 0) {
        fwrite(p->pCellStr,(long)Num,1,__s);
      }
      fclose(__s);
      return;
    }
    iVar4 = p->vTtMem[lVar3]->nEntrySize;
    Num = p->vTtMem[lVar3]->nEntries;
    fwrite(&Num,4,1,__s);
    for (i = 0; i < p->vTtMem[lVar3]->nEntries; i = i + 1) {
      __ptr_00 = Vec_MemReadEntry(p->vTtMem[lVar3],i);
      if (__ptr_00 == (word *)0x0) break;
      fwrite(__ptr_00,(long)(iVar4 << 3),1,__s);
    }
    Num = p->vTtDecs[lVar3]->nSize;
    fwrite(&Num,4,1,__s);
    for (iVar4 = 0; iVar4 < p->vTtDecs[lVar3]->nSize; iVar4 = iVar4 + 1) {
      pvVar1 = Vec_PtrEntry(p->vTtDecs[lVar3],iVar4);
      Num = *(int *)((long)pvVar1 + 4);
      fwrite(&Num,4,1,__s);
      fwrite(*(void **)((long)pvVar1 + 8),(long)Num << 2,1,__s);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void If_DsdManSave( If_DsdMan_t * p, char * pFileName )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    word * pTruth; 
    int i, v, Num;
    FILE * pFile = fopen( pFileName ? pFileName : p->pStore, "wb" );
    if ( pFile == NULL )
    {
        printf( "Writing DSD manager file \"%s\" has failed.\n", pFileName ? pFileName : p->pStore );
        return;
    }
    fwrite( DSD_VERSION, 4, 1, pFile );
    Num = p->nVars;
    fwrite( &Num, 4, 1, pFile );
    Num = p->LutSize;
    fwrite( &Num, 4, 1, pFile );
    Num = Vec_PtrSize(&p->vObjs);
    fwrite( &Num, 4, 1, pFile );
    Vec_PtrForEachEntryStart( If_DsdObj_t *, &p->vObjs, pObj, i, 2 )
    {
        Num = If_DsdObjWordNum( pObj->nFans );
        fwrite( &Num, 4, 1, pFile );
        fwrite( pObj, sizeof(word)*Num, 1, pFile );
        if ( pObj->Type == IF_DSD_PRIME )
            fwrite( Vec_IntEntryP(&p->vTruths, i), 4, 1, pFile );
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        Num = Vec_MemEntryNum(p->vTtMem[v]);
        fwrite( &Num, 4, 1, pFile );
        Vec_MemForEachEntry( p->vTtMem[v], pTruth, i )
            fwrite( pTruth, nBytes, 1, pFile );
        Num = Vec_PtrSize(p->vTtDecs[v]);
        fwrite( &Num, 4, 1, pFile );
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vSets, i )
        {
            Num = Vec_IntSize(vSets);
            fwrite( &Num, 4, 1, pFile );
            fwrite( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
        }
    }
    Num = p->nConfigWords;
    fwrite( &Num, 4, 1, pFile );
    Num = p->nTtBits;
    fwrite( &Num, 4, 1, pFile );
    Num = p->vConfigs ? Vec_WrdSize(p->vConfigs) : 0;
    fwrite( &Num, 4, 1, pFile );
    if ( Num )
        fwrite( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    Num = p->pCellStr ? strlen(p->pCellStr) : 0;
    fwrite( &Num, 4, 1, pFile );
    if ( Num )
        fwrite( p->pCellStr, sizeof(char)*Num, 1, pFile );
    fclose( pFile );
}